

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd2.c
# Opt level: O3

gdImagePtr gdImageCreateFromGd2Part(FILE *inFile,int srcx,int srcy,int w,int h)

{
  gdIOCtx *in;
  gdImagePtr pgVar1;
  
  in = gdNewFileCtx(inFile);
  if (in == (gdIOCtx *)0x0) {
    pgVar1 = (gdImagePtr)0x0;
  }
  else {
    pgVar1 = gdImageCreateFromGd2PartCtx(in,srcx,srcy,w,h);
    (*in->gd_free)(in);
  }
  return pgVar1;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGd2Part (FILE * inFile, int srcx, int srcy, int w, int h)
{
	gdImagePtr im;
	gdIOCtx *in = gdNewFileCtx (inFile);

	if (in == NULL) return NULL;
	im = gdImageCreateFromGd2PartCtx (in, srcx, srcy, w, h);

	in->gd_free (in);

	return im;
}